

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_size_isos_dim<3>(Omega_h *this,Reals *metrics)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_c0;
  undefined1 local_b0 [8];
  type f;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  Write<double> out;
  int n;
  Reals *metrics_local;
  ulong local_10;
  
  if (((ulong)(metrics->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((metrics->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(metrics->write_).shared_alloc_.alloc >> 3;
  }
  size_in = divide_no_remainder<int>((int)(local_10 >> 3),6);
  out.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Write<double>::Write((Write<double> *)local_58,size_in,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Read<double>::Read((Read<double> *)local_b0,metrics);
  Write<double>::Write
            ((Write<double> *)&f.metrics.write_.shared_alloc_.direct_ptr,(Write<double> *)local_58);
  parallel_for<Omega_h::get_size_isos_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_b0,"get_size_isos");
  Write<double>::Write(&local_c0,(Write<signed_char> *)local_58);
  Read<double>::Read((Read<double> *)this,&local_c0);
  Write<double>::~Write(&local_c0);
  get_size_isos_dim<3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_b0);
  Write<double>::~Write((Write<double> *)local_58);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals get_size_isos_dim(Reals metrics) {
  auto n = divide_no_remainder(metrics.size(), symm_ncomps(dim));
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto m = get_symm<dim>(metrics, i);
    out[i] = root<dim>(determinant(m));
  };
  parallel_for(n, f, "get_size_isos");
  return out;
}